

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void * ma_dr_mp3_malloc(size_t sz,ma_allocation_callbacks *pAllocationCallbacks)

{
  size_t in_RSI;
  size_t in_RDI;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    local_8 = ma_dr_mp3__malloc_default(in_RDI,(void *)0x0);
  }
  else {
    local_8 = ma_dr_mp3__malloc_from_callbacks(in_RSI,(ma_allocation_callbacks *)0x25a302);
  }
  return local_8;
}

Assistant:

MA_API void* ma_dr_mp3_malloc(size_t sz, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks != NULL) {
        return ma_dr_mp3__malloc_from_callbacks(sz, pAllocationCallbacks);
    } else {
        return ma_dr_mp3__malloc_default(sz, NULL);
    }
}